

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::Matrix44::sub_and_store(jpgd_block_t *pDst,Matrix44 *a,Matrix44 *b)

{
  Element_Type EVar1;
  Element_Type *pEVar2;
  int local_24;
  int r;
  Matrix44 *b_local;
  Matrix44 *a_local;
  jpgd_block_t *pDst_local;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pEVar2 = at(a,local_24,0);
    EVar1 = *pEVar2;
    pEVar2 = at(b,local_24,0);
    pDst[local_24] = (short)EVar1 - (short)*pEVar2;
    pEVar2 = at(a,local_24,1);
    EVar1 = *pEVar2;
    pEVar2 = at(b,local_24,1);
    pDst[local_24 + 8] = (short)EVar1 - (short)*pEVar2;
    pEVar2 = at(a,local_24,2);
    EVar1 = *pEVar2;
    pEVar2 = at(b,local_24,2);
    pDst[local_24 + 0x10] = (short)EVar1 - (short)*pEVar2;
    pEVar2 = at(a,local_24,3);
    EVar1 = *pEVar2;
    pEVar2 = at(b,local_24,3);
    pDst[local_24 + 0x18] = (short)EVar1 - (short)*pEVar2;
  }
  return;
}

Assistant:

static inline void sub_and_store(jpgd_block_t* pDst, const Matrix44& a, const Matrix44& b)
    {
      for (int r = 0; r < 4; r++)
      {
        pDst[0*8 + r] = static_cast<jpgd_block_t>(a.at(r, 0) - b.at(r, 0));
        pDst[1*8 + r] = static_cast<jpgd_block_t>(a.at(r, 1) - b.at(r, 1));
        pDst[2*8 + r] = static_cast<jpgd_block_t>(a.at(r, 2) - b.at(r, 2));
        pDst[3*8 + r] = static_cast<jpgd_block_t>(a.at(r, 3) - b.at(r, 3));
      }
    }